

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O1

void __thiscall
duckdb::Transformer::AddPivotEntry
          (Transformer *this,string *enum_name,
          unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *base,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *column,unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                  *subquery,bool has_parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Transformer *this_00;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var7;
  pointer pCVar8;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false> local_70;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_68;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_60;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_58;
  string local_50;
  
  if ((this->parent).ptr == (Transformer *)0x0) {
    local_70._M_head_impl = (CreatePivotEntry *)operator_new(0x40);
    ((local_70._M_head_impl)->enum_name)._M_dataplus._M_p = (pointer)0x0;
    ((local_70._M_head_impl)->enum_name)._M_string_length = 0;
    ((local_70._M_head_impl)->enum_name).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&((local_70._M_head_impl)->enum_name).field_2 + 8) = 0;
    ((local_70._M_head_impl)->subquery).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    *(undefined8 *)&(local_70._M_head_impl)->has_parameters = 0;
    ((local_70._M_head_impl)->base).
    super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl = (SelectNode *)0x0;
    ((local_70._M_head_impl)->column).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    ((local_70._M_head_impl)->enum_name)._M_dataplus._M_p =
         (pointer)&((local_70._M_head_impl)->enum_name).field_2;
    ((local_70._M_head_impl)->enum_name)._M_string_length = 0;
    ((local_70._M_head_impl)->enum_name).field_2._M_local_buf[0] = '\0';
    ((local_70._M_head_impl)->subquery).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    pCVar8 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&local_70);
    ::std::__cxx11::string::operator=((string *)pCVar8,(string *)enum_name);
    pCVar8 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&local_70);
    _Var2._M_head_impl =
         (base->super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    (base->super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl = (SelectNode *)0x0;
    _Var3._M_head_impl =
         (pCVar8->base).
         super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    (pCVar8->base).super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var3._M_head_impl != (SelectNode *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_QueryNode + 8))();
    }
    pCVar8 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&local_70);
    _Var4._M_head_impl =
         (column->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (column->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    _Var5._M_head_impl =
         (pCVar8->column).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar8->column).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
    }
    pCVar8 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&local_70);
    _Var6._M_head_impl =
         (subquery->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
         _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (subquery->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    _Var7._M_head_impl =
         (pCVar8->subquery).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pCVar8->subquery).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var7._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var7._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pCVar8 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
             ::operator->((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                           *)&local_70);
    pCVar8->has_parameters = has_parameters;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>,std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>,std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,std::default_delete<duckdb::Transformer::CreatePivotEntry>,true>>>
                *)&this->pivot_entries,
               (unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
                *)&local_70);
    if (local_70._M_head_impl != (CreatePivotEntry *)0x0) {
      ::std::default_delete<duckdb::Transformer::CreatePivotEntry>::operator()
                ((default_delete<duckdb::Transformer::CreatePivotEntry> *)&local_70,
                 local_70._M_head_impl);
    }
  }
  else {
    optional_ptr<duckdb::Transformer,_true>::CheckValid(&this->parent);
    this_00 = (this->parent).ptr;
    local_50._M_dataplus._M_p = (enum_name->_M_dataplus)._M_p;
    paVar1 = &enum_name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == paVar1) {
      local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_50.field_2._8_8_ = *(undefined8 *)((long)&enum_name->field_2 + 8);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_50._M_string_length = enum_name->_M_string_length;
    (enum_name->_M_dataplus)._M_p = (pointer)paVar1;
    enum_name->_M_string_length = 0;
    (enum_name->field_2)._M_local_buf[0] = '\0';
    local_58._M_head_impl =
         (base->super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)._M_t
         .super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    (base->super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl = (SelectNode *)0x0;
    local_60._M_head_impl =
         (column->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (column->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    local_68._M_head_impl =
         (subquery->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>).
         _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (subquery->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    AddPivotEntry(this_00,&local_50,
                  (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> *)
                  &local_58,
                  (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   *)&local_60,
                  (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                  &local_68,has_parameters);
    if (local_68._M_head_impl != (QueryNode *)0x0) {
      (*(local_68._M_head_impl)->_vptr_QueryNode[1])();
    }
    local_68._M_head_impl = (QueryNode *)0x0;
    if (local_60._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_60._M_head_impl = (ParsedExpression *)0x0;
    if (local_58._M_head_impl != (SelectNode *)0x0) {
      (*((local_58._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
    local_58._M_head_impl = (SelectNode *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Transformer::AddPivotEntry(string enum_name, unique_ptr<SelectNode> base, unique_ptr<ParsedExpression> column,
                                unique_ptr<QueryNode> subquery, bool has_parameters) {
	if (parent) {
		parent->AddPivotEntry(std::move(enum_name), std::move(base), std::move(column), std::move(subquery),
		                      has_parameters);
		return;
	}
	auto result = make_uniq<CreatePivotEntry>();
	result->enum_name = std::move(enum_name);
	result->base = std::move(base);
	result->column = std::move(column);
	result->subquery = std::move(subquery);
	result->has_parameters = has_parameters;

	pivot_entries.push_back(std::move(result));
}